

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int findreplaceengine(bstring b,const_bstring find,const_bstring repl,int pos,instr_fnptr instr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bstring b_00;
  uchar *puVar5;
  int *piVar6;
  uchar *puVar7;
  ulong uVar8;
  int iVar9;
  size_t __n;
  long lVar10;
  long lVar11;
  bool bVar12;
  int *local_f0;
  bstring local_e8;
  long local_d8;
  int static_d [33];
  
  iVar4 = -1;
  if (b == (bstring)0x0) {
    return -1;
  }
  puVar5 = b->data;
  if (find == (const_bstring)0x0 || puVar5 == (uchar *)0x0) {
    return -1;
  }
  if (repl == (const_bstring)0x0 || find->data == (uchar *)0x0) {
    return -1;
  }
  puVar7 = repl->data;
  if (pos < 0 || puVar7 == (uchar *)0x0) {
    return -1;
  }
  iVar9 = find->slen;
  if (iVar9 < 1) {
    return -1;
  }
  if (b->mlen < 1) {
    return -1;
  }
  uVar1 = b->slen;
  if ((uint)b->mlen < uVar1) {
    return -1;
  }
  iVar3 = repl->slen;
  if (iVar3 < 0) {
    return -1;
  }
  if ((int)(uVar1 - iVar9) < pos) {
LAB_0012ee3d:
    iVar4 = 0;
  }
  else {
    lVar10 = (long)find->data - (long)puVar5;
    b_00 = find;
    if (lVar10 < (long)(ulong)uVar1 && pos - iVar9 < lVar10) {
      b_00 = bstrcpy(find);
      if (b_00 == (bstring)0x0) {
        return -1;
      }
      puVar7 = repl->data;
      puVar5 = b->data;
      iVar3 = repl->slen;
    }
    local_e8 = repl;
    if (((long)(pos - iVar3) < (long)puVar7 - (long)puVar5) &&
       ((long)puVar7 - (long)puVar5 < (long)b->slen)) {
      local_e8 = bstrcpy(repl);
      if (local_e8 != (bstring)0x0) {
        iVar3 = local_e8->slen;
        goto LAB_0012eedb;
      }
      if (b_00 == find) {
        return -1;
      }
    }
    else {
LAB_0012eedb:
      uVar1 = b_00->slen - iVar3;
      if (uVar1 == 0) {
        while (uVar1 = (*instr)(b,pos,b_00), -1 < (int)uVar1) {
          memcpy(b->data + uVar1,local_e8->data,(long)local_e8->slen);
          pos = b_00->slen + uVar1;
        }
        if (b_00 != find) {
          bdestroy(b_00);
        }
        if (local_e8 != repl) {
          bdestroy(local_e8);
        }
        goto LAB_0012ee3d;
      }
      if ((int)uVar1 < 1) {
        local_f0 = static_d;
        uVar8 = 0;
        uVar2 = 0x20;
        iVar4 = -1;
        iVar9 = 0;
        do {
          iVar3 = (*instr)(b,pos,b_00);
          if (iVar3 < 0) {
            iVar3 = b->slen;
            local_f0[uVar8 & 0xffffffff] = iVar3;
            iVar3 = balloc(b,iVar3 + iVar9 + 1);
            if (iVar3 == 0) {
              b->slen = b->slen + iVar9;
              lVar10 = (long)iVar9;
              for (; 0 < (long)uVar8; uVar8 = uVar8 - 1) {
                lVar11 = (long)b_00->slen + (long)local_f0[uVar8 - 1];
                iVar4 = local_f0[uVar8] - (int)lVar11;
                if (iVar4 != 0) {
                  memmove(b->data + lVar11 + lVar10,b->data + lVar11,(long)iVar4);
                }
                __n = (size_t)local_e8->slen;
                if (__n != 0) {
                  memmove(b->data + lVar10 + (lVar11 - __n),local_e8->data,__n);
                }
                lVar10 = lVar10 + (int)uVar1;
              }
              b->data[b->slen] = '\0';
              iVar4 = 0;
            }
            break;
          }
          if ((long)(int)(uVar2 - 1) <= (long)uVar8) {
            if (0x7ffffff < uVar2) break;
            piVar6 = (int *)0x0;
            if (static_d != local_f0) {
              piVar6 = local_f0;
            }
            local_f0 = piVar6;
            piVar6 = (int *)realloc(local_f0,(ulong)(uVar2 << 4));
            if (piVar6 == (int *)0x0) goto LAB_0012f268;
            uVar2 = uVar2 * 2;
            bVar12 = local_f0 == (int *)0x0;
            local_f0 = piVar6;
            if (bVar12) {
              memcpy(piVar6,static_d,0x84);
            }
          }
          local_f0[uVar8] = iVar3;
          uVar8 = uVar8 + 1;
          iVar9 = iVar9 - uVar1;
          pos = iVar3 + b_00->slen;
        } while (-1 < pos);
        if (static_d != local_f0) {
LAB_0012f268:
          free(local_f0);
        }
        if (b_00 != find) {
          bdestroy(b_00);
        }
      }
      else {
        local_d8 = 0;
        local_f0 = (int *)0x0;
        while( true ) {
          uVar2 = (*instr)(b,pos,b_00);
          if ((int)uVar2 < 0) break;
          if ((local_f0 != (int *)0x0) && (uVar2 - pos != 0 && pos <= (int)uVar2)) {
            memmove(b->data + pos + local_d8,b->data + pos,(long)(int)(uVar2 - pos));
          }
          if ((long)local_e8->slen != 0) {
            memcpy(b->data + local_d8 + (ulong)uVar2,local_e8->data,(long)local_e8->slen);
          }
          local_f0 = (int *)((long)local_f0 + (ulong)uVar1);
          pos = uVar2 + b_00->slen;
          local_d8 = local_d8 - (ulong)uVar1;
        }
        if (local_f0 != (int *)0x0) {
          iVar4 = b->slen;
          if (iVar4 - pos != 0 && pos <= iVar4) {
            memmove(b->data + pos + -((ulong)local_f0 & 0xffffffff),b->data + pos,
                    (long)(iVar4 - pos));
            iVar4 = b->slen;
          }
          b->slen = iVar4 - (int)local_f0;
          b->data[iVar4 - (int)local_f0] = '\0';
        }
        if (b_00 != find) {
          bdestroy(b_00);
        }
        iVar4 = 0;
      }
      b_00 = local_e8;
      if (local_e8 == repl) {
        return iVar4;
      }
    }
    bdestroy(b_00);
  }
  return iVar4;
}

Assistant:

static int findreplaceengine (bstring b, const_bstring find,
                              const_bstring repl, int pos,
                              instr_fnptr instr) {
int i, ret, slen, mlen, delta, acc;
int * d;
int static_d[INITIAL_STATIC_FIND_INDEX_COUNT+1]; /* This +1 is for LINT. */
ptrdiff_t pd;
bstring auxf = (bstring) find;
bstring auxr = (bstring) repl;

	if (b == NULL || b->data == NULL || find == NULL ||
		find->data == NULL || repl == NULL || repl->data == NULL ||
		pos < 0 || find->slen <= 0 || b->mlen <= 0 || b->slen > b->mlen ||
		b->slen < 0 || repl->slen < 0) return BSTR_ERR;
	if (pos > b->slen - find->slen) return BSTR_OK;

	/* Alias with find string */
	pd = (ptrdiff_t) (find->data - b->data);
	if ((ptrdiff_t) (pos - find->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxf = bstrcpy (find))) return BSTR_ERR;
	}

	/* Alias with repl string */
	pd = (ptrdiff_t) (repl->data - b->data);
	if ((ptrdiff_t) (pos - repl->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxr = bstrcpy (repl))) {
			if (auxf != find) bdestroy (auxf);
			return BSTR_ERR;
		}
	}

	delta = auxf->slen - auxr->slen;

	/* in-place replacement since find and replace strings are of equal
	   length */
	if (delta == 0) {
		while ((pos = instr (b, pos, auxf)) >= 0) {
			bstr__memcpy (b->data + pos, auxr->data, auxr->slen);
			pos += auxf->slen;
		}
		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return BSTR_OK;
	}

	/* shrinking replacement since auxf->slen > auxr->slen */
	if (delta > 0) {
		acc = 0;

		while ((i = instr (b, pos, auxf)) >= 0) {
			if (acc && i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			if (auxr->slen)
				bstr__memcpy (b->data + i - acc, auxr->data, auxr->slen);
			acc += delta;
			pos = i + auxf->slen;
		}

		if (acc) {
			i = b->slen;
			if (i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			b->slen -= acc;
			b->data[b->slen] = (unsigned char) '\0';
		}

		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return BSTR_OK;
	}

	/* expanding replacement since find->slen < repl->slen.  Its a lot
	   more complicated.  This works by first finding all the matches and
	   storing them to a growable array, then doing at most one resize of
	   the destination bstring and then performing the direct memory transfers
	   of the string segment pieces to form the final result. The growable
	   array of matches uses a deferred doubling reallocing strategy.  What
	   this means is that it starts as a reasonably fixed sized auto array in
	   the hopes that many if not most cases will never need to grow this
	   array.  But it switches as soon as the bounds of the array will be
	   exceeded.  An extra find result is always appended to this array that
	   corresponds to the end of the destination string, so slen is checked
	   against mlen - 1 rather than mlen before resizing.
	*/

	mlen = INITIAL_STATIC_FIND_INDEX_COUNT;
	d = (int *) static_d; /* Avoid malloc for trivial/initial cases */
	acc = slen = 0;

	while ((pos = instr (b, pos, auxf)) >= 0) {
		if (slen >= mlen - 1) {
			int *t;
			int sl;
			/* Overflow */
			if (mlen > (INT_MAX / sizeof(int *)) / 2) {
				ret = BSTR_ERR;
				goto done;
			}
			mlen += mlen;
			sl = sizeof (int *) * mlen;
			if (static_d == d) d = NULL; /* static_d cannot be realloced */
			if (NULL == (t = (int *) bstr__realloc (d, sl))) {
				ret = BSTR_ERR;
				goto done;
			}
			if (NULL == d) bstr__memcpy (t, static_d, sizeof (static_d));
			d = t;
		}
		d[slen] = pos;
		slen++;
		acc -= delta;
		pos += auxf->slen;
		if (pos < 0 || acc < 0) {
			ret = BSTR_ERR;
			goto done;
		}
	}

	/* slen <= INITIAL_STATIC_INDEX_COUNT-1 or mlen-1 here. */
	d[slen] = b->slen;

	if (BSTR_OK == (ret = balloc (b, b->slen + acc + 1))) {
		b->slen += acc;
		for (i = slen-1; i >= 0; i--) {
			int s, l;
			s = d[i] + auxf->slen;
			l = d[i+1] - s; /* d[slen] may be accessed here. */
			if (l) {
				bstr__memmove (b->data + s + acc, b->data + s, l);
			}
			if (auxr->slen) {
				bstr__memmove (b->data + s + acc - auxr->slen,
				               auxr->data, auxr->slen);
			}
			acc += delta;
		}
		b->data[b->slen] = (unsigned char) '\0';
	}

	done:;
	if (static_d != d) bstr__free (d);
	if (auxf != find) bdestroy (auxf);
	if (auxr != repl) bdestroy (auxr);
	return ret;
}